

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_insert_after(lyd_node *sibling,lyd_node *node)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  
  if (sibling == (lyd_node *)0x0) {
    pcVar6 = "sibling";
LAB_001212ff:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_insert_after")
    ;
    return LY_EINVAL;
  }
  if (node == (lyd_node *)0x0) {
    pcVar6 = "node";
    goto LAB_001212ff;
  }
  if (sibling == node) {
    pcVar6 = "sibling != node";
    goto LAB_001212ff;
  }
  plVar1 = sibling->schema;
  if (plVar1 == (lysc_node *)0x0) {
    plVar7 = (ly_ctx *)sibling[2].schema;
  }
  else {
    plVar7 = plVar1->module->ctx;
  }
  if (plVar7 != (ly_ctx *)0x0) {
    plVar2 = node->schema;
    if (plVar2 == (lysc_node *)0x0) {
      plVar7 = (ly_ctx *)node[2].schema;
    }
    else {
      plVar7 = plVar2->module->ctx;
    }
    if (plVar7 != (ly_ctx *)0x0) {
      if (plVar1 == (lysc_node *)0x0) {
        plVar5 = (lys_module *)&sibling[2].schema;
      }
      else {
        plVar5 = plVar1->module;
      }
      if (plVar2 == (lysc_node *)0x0) {
        plVar4 = (lys_module *)&node[2].schema;
      }
      else {
        plVar4 = plVar2->module;
      }
      if (plVar5->ctx != plVar4->ctx) {
        if (plVar1 == (lysc_node *)0x0) {
          plVar5 = (lys_module *)&sibling[2].schema;
        }
        else {
          plVar5 = plVar1->module;
        }
        plVar7 = plVar5->ctx;
        pcVar6 = "Different contexts mixed in a single function call.";
        goto LAB_0012140a;
      }
    }
  }
  LVar3 = lyd_insert_check_schema((lysc_node *)0x0,plVar1,node->schema);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar1 = node->schema;
  if (plVar1 == (lysc_node *)0x0) {
LAB_001213d7:
    lyd_unlink(node);
    lyd_insert_after_node((lyd_node **)0x0,sibling,node);
    lyd_insert_hash(node);
    return LY_SUCCESS;
  }
  if (((plVar1->nodetype & 0x18) == 0) || ((plVar1->flags & 0x40) == 0)) {
    if (sibling->schema == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&sibling[2].schema;
    }
    else {
      plVar5 = sibling->schema->module;
    }
    plVar7 = plVar5->ctx;
    pcVar6 = "Can be used only for user-ordered nodes.";
  }
  else {
    if ((plVar1 == (lysc_node *)0x0) ||
       (plVar2 = sibling->schema, plVar1 == plVar2 || plVar2 == (lysc_node *)0x0))
    goto LAB_001213d7;
    plVar7 = plVar2->module->ctx;
    pcVar6 = "Cannot insert after a different schema node instance.";
  }
LAB_0012140a:
  ly_log(plVar7,LY_LLERR,LY_EINVAL,pcVar6);
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_insert_after(struct lyd_node *sibling, struct lyd_node *node)
{
    LY_CHECK_ARG_RET(NULL, sibling, node, sibling != node, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(LYD_CTX(sibling), LYD_CTX(node), LY_EINVAL);

    LY_CHECK_RET(lyd_insert_check_schema(NULL, sibling->schema, node->schema));

    if (node->schema && (!(node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(node->schema->flags & LYS_ORDBY_USER))) {
        LOGERR(LYD_CTX(sibling), LY_EINVAL, "Can be used only for user-ordered nodes.");
        return LY_EINVAL;
    }
    if (node->schema && sibling->schema && (node->schema != sibling->schema)) {
        LOGERR(LYD_CTX(sibling), LY_EINVAL, "Cannot insert after a different schema node instance.");
        return LY_EINVAL;
    }

    lyd_unlink(node);
    lyd_insert_after_node(NULL, sibling, node);
    lyd_insert_hash(node);

    return LY_SUCCESS;
}